

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

bool __thiscall
cmLocalUnixMakefileGenerator3::UpdateDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *tgtInfo,bool verbose,bool color)

{
  cmFileTimeCache *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  string *psVar6;
  bool bVar7;
  int result_1;
  int result;
  undefined4 uStack_664;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  validDependencies;
  string internalDependFile;
  string targetDir;
  string dependFile;
  ostringstream msg;
  
  bVar1 = cmMakefile::ReadListFile
                    ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,tgtInfo);
  if ((!bVar1) || (bVar1 = cmSystemTools::GetErrorOccuredFlag(), bVar1)) {
    cmSystemTools::Error
              ("Target DependInfo.cmake file not found",(char *)0x0,(char *)0x0,(char *)0x0);
  }
  CheckMultipleOutputs(this,verbose);
  cmsys::SystemTools::GetFilenamePath(&targetDir,tgtInfo);
  std::operator+(&internalDependFile,&targetDir,"/depend.internal");
  std::operator+(&dependFile,&targetDir,"/depend.make");
  this_00 = ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            CMakeInstance->FileTimeCache;
  bVar1 = cmFileTimeCache::Compare(this_00,&internalDependFile,tgtInfo,&result);
  bVar7 = -1 < result;
  if (verbose && (!bVar1 || !bVar7)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar5 = std::operator<<((ostream *)&msg,"Dependee \"");
    poVar5 = std::operator<<(poVar5,(string *)tgtInfo);
    poVar5 = std::operator<<(poVar5,"\" is newer than depender \"");
    poVar5 = std::operator<<(poVar5,(string *)&internalDependFile);
    poVar5 = std::operator<<(poVar5,"\".");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((string *)&validDependencies);
    std::__cxx11::string::~string((string *)&validDependencies);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  }
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&validDependencies,(string *)psVar6);
  std::__cxx11::string::append((char *)&validDependencies);
  std::__cxx11::string::append((char *)&validDependencies);
  bVar2 = cmFileTimeCache::Compare
                    (this_00,&internalDependFile,(string *)&validDependencies,&result_1);
  if (!bVar2 || result_1 < 0) {
    if (verbose) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
      poVar5 = std::operator<<((ostream *)&msg,"Dependee \"");
      poVar5 = std::operator<<(poVar5,(string *)&validDependencies);
      poVar5 = std::operator<<(poVar5,"\" is newer than depender \"");
      poVar5 = std::operator<<(poVar5,(string *)&internalDependFile);
      poVar5 = std::operator<<(poVar5,"\".");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Stdout((string *)&result);
      std::__cxx11::string::~string((string *)&result);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
    }
    std::__cxx11::string::~string((string *)&validDependencies);
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &validDependencies._M_t._M_impl.super__Rb_tree_header._M_header;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    std::__cxx11::string::~string((string *)&validDependencies);
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &validDependencies._M_t._M_impl.super__Rb_tree_header._M_header;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    cmDependsC::cmDependsC((cmDependsC *)&msg);
    bVar3 = cmDepends::Check((cmDepends *)&msg,&dependFile,&internalDependFile,&validDependencies);
    cmDependsC::~cmDependsC((cmDependsC *)&msg);
    bVar4 = true;
    if ((bVar1 && bVar7) && ((bVar2 && result_1 >= 0) && bVar3)) goto LAB_00318918;
  }
  cmsys::SystemTools::GetFilenameName((string *)&msg,&targetDir);
  std::__cxx11::string::substr((ulong)&result,(ulong)&msg);
  std::__cxx11::string::operator=((string *)&msg,(string *)&result);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"Scanning dependencies of target ",(allocator<char> *)&result_1);
  std::__cxx11::string::append((string *)&result);
  cmSystemTools::MakefileColorEcho(0x106,(char *)CONCAT44(uStack_664,result),true,color);
  bVar4 = ScanDependencies(this,&targetDir,&dependFile,&internalDependFile,&validDependencies);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&msg);
LAB_00318918:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  ::~_Rb_tree(&validDependencies._M_t);
  std::__cxx11::string::~string((string *)&dependFile);
  std::__cxx11::string::~string((string *)&internalDependFile);
  std::__cxx11::string::~string((string *)&targetDir);
  return bVar4;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::UpdateDependencies(
  const std::string& tgtInfo, bool verbose, bool color)
{
  // read in the target info file
  if (!this->Makefile->ReadListFile(tgtInfo) ||
      cmSystemTools::GetErrorOccuredFlag()) {
    cmSystemTools::Error("Target DependInfo.cmake file not found");
  }

  // Check if any multiple output pairs have a missing file.
  this->CheckMultipleOutputs(verbose);

  std::string const targetDir = cmSystemTools::GetFilenamePath(tgtInfo);
  std::string const internalDependFile = targetDir + "/depend.internal";
  std::string const dependFile = targetDir + "/depend.make";

  // If the target DependInfo.cmake file has changed since the last
  // time dependencies were scanned then force rescanning.  This may
  // happen when a new source file is added and CMake regenerates the
  // project but no other sources were touched.
  bool needRescanDependInfo = false;
  cmFileTimeCache* ftc =
    this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache();
  {
    int result;
    if (!ftc->Compare(internalDependFile, tgtInfo, &result) || result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Dependee \"" << tgtInfo << "\" is newer than depender \""
            << internalDependFile << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str());
      }
      needRescanDependInfo = true;
    }
  }

  // If the directory information is newer than depend.internal, include dirs
  // may have changed. In this case discard all old dependencies.
  bool needRescanDirInfo = false;
  {
    std::string dirInfoFile = this->GetCurrentBinaryDirectory();
    dirInfoFile += "/CMakeFiles";
    dirInfoFile += "/CMakeDirectoryInformation.cmake";
    int result;
    if (!ftc->Compare(internalDependFile, dirInfoFile, &result) ||
        result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Dependee \"" << dirInfoFile << "\" is newer than depender \""
            << internalDependFile << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str());
      }
      needRescanDirInfo = true;
    }
  }

  // Check the implicit dependencies to see if they are up to date.
  // The build.make file may have explicit dependencies for the object
  // files but these will not affect the scanning process so they need
  // not be considered.
  std::map<std::string, cmDepends::DependencyVector> validDependencies;
  bool needRescanDependencies = false;
  if (!needRescanDirInfo) {
    cmDependsC checker;
    checker.SetVerbose(verbose);
    checker.SetFileTimeCache(ftc);
    // cmDependsC::Check() fills the vector validDependencies() with the
    // dependencies for those files where they are still valid, i.e. neither
    // the files themselves nor any files they depend on have changed.
    // We don't do that if the CMakeDirectoryInformation.cmake file has
    // changed, because then potentially all dependencies have changed.
    // This information is given later on to cmDependsC, which then only
    // rescans the files where it did not get valid dependencies via this
    // dependency vector. This means that in the normal case, when only
    // few or one file have been edited, then also only this one file is
    // actually scanned again, instead of all files for this target.
    needRescanDependencies =
      !checker.Check(dependFile, internalDependFile, validDependencies);
  }

  if (needRescanDependInfo || needRescanDirInfo || needRescanDependencies) {
    // The dependencies must be regenerated.
    std::string targetName = cmSystemTools::GetFilenameName(targetDir);
    targetName = targetName.substr(0, targetName.length() - 4);
    std::string message = "Scanning dependencies of target ";
    message += targetName;
    cmSystemTools::MakefileColorEcho(cmsysTerminal_Color_ForegroundMagenta |
                                       cmsysTerminal_Color_ForegroundBold,
                                     message.c_str(), true, color);

    return this->ScanDependencies(targetDir, dependFile, internalDependFile,
                                  validDependencies);
  }

  // The dependencies are already up-to-date.
  return true;
}